

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O1

uint __thiscall
ON_SubDSectorType::GetSubdivisionMatrix(ON_SubDSectorType *this,double *S,size_t S_capacity)

{
  uint uVar1;
  double **S_00;
  double *pdVar2;
  ulong uVar3;
  ulong S_capacity_00;
  
  if (((S != (double *)0x0 && 8 < S_capacity) && (uVar1 = PointRingCount(this), 2 < uVar1)) &&
     (uVar1 * uVar1 <= S_capacity)) {
    S_capacity_00 = (ulong)uVar1;
    S_00 = (double **)operator_new__(S_capacity_00 * 8,(nothrow_t *)&std::nothrow);
    if (S_00 != (double **)0x0) {
      *S_00 = S;
      pdVar2 = S + S_capacity_00;
      uVar3 = 1;
      do {
        S_00[uVar3] = pdVar2;
        uVar3 = uVar3 + 1;
        pdVar2 = pdVar2 + S_capacity_00;
      } while (S_capacity_00 != uVar3);
      uVar1 = GetSubdivisionMatrix(this,S_00,S_capacity_00);
      operator_delete__(S_00);
      return uVar1;
    }
  }
  ON_SubDIncrementErrorCount();
  return 0;
}

Assistant:

unsigned int ON_SubDSectorType::GetSubdivisionMatrix(
  double* S,
  size_t S_capacity
  ) const
{
  if ( S_capacity < 9 || nullptr == S )
    return ON_SUBD_RETURN_ERROR(0);

  const unsigned int R = PointRingCount();
  if (R < 3)
    return ON_SUBD_RETURN_ERROR(0);

  if ( S_capacity < R*R )
    return ON_SUBD_RETURN_ERROR(0);

  double** Srows = new(std::nothrow) double* [R];
  if ( nullptr == Srows)
    return ON_SUBD_RETURN_ERROR(0);
  Srows[0] = S;
  for (unsigned int i = 1; i < R; i++)
  {
    Srows[i] = Srows[i-1] + R;
  }

  const unsigned int rc = GetSubdivisionMatrix(Srows, R);
  
  delete[] Srows;

  return rc;
}